

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

bool_t utilOnExit(_func_void_varargs *fn)

{
  bool_t bVar1;
  size_t sVar2;
  util_onexit_t *pp_Var3;
  uint uVar4;
  
  bVar1 = mtCallOnce(&_once,utilOnExitInit);
  uVar4 = 0;
  if ((bVar1 != 0) && ((_inited & 1) != 0)) {
    mtMtxLock(_mtx);
    pp_Var3 = _fns;
    sVar2 = blobSize(_fns);
    pp_Var3 = (util_onexit_t *)blobResize(pp_Var3,sVar2 + 8);
    if (pp_Var3 != (util_onexit_t *)0x0) {
      _fns = pp_Var3;
      sVar2 = blobSize(pp_Var3);
      *(_func_void_varargs **)((long)pp_Var3 + ((sVar2 & 0xfffffffffffffff8) - 8)) = fn;
    }
    uVar4 = (uint)(pp_Var3 != (util_onexit_t *)0x0);
    mtMtxUnlock(_mtx);
  }
  return uVar4;
}

Assistant:

bool_t utilOnExit(void (*fn)())
{
	blob_t b;
	// инициализировать однократно
	if (!mtCallOnce(&_once, utilOnExitInit) || !_inited)
		return FALSE;
	// расширить список
	mtMtxLock(_mtx);
	ASSERT(blobIsValid(_fns));
	b = blobResize(_fns, blobSize(_fns) + sizeof(util_onexit_t));
	if (!b)
	{
		mtMtxUnlock(_mtx);
		return FALSE;
	}
	ASSERT(blobSize(_fns) % sizeof(util_onexit_t) == 0);
	_fns = (util_onexit_t*)b;
	// добавить функцию
	_fns[blobSize(_fns) / sizeof(util_onexit_t) - 1] = fn;
	mtMtxUnlock(_mtx);
	return TRUE;
}